

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O1

void __thiscall Maybe_Nothing_Test::TestBody(Maybe_Nothing_Test *this)

{
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  maybe<(anonymous_namespace)::value,_void> local_58;
  EqHelper local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  maybe<(anonymous_namespace)::value,_void> local_28;
  
  local_58.storage_._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._0_8_ = (long *)0x0;
  local_58.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_28.storage_._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._0_8_ = 0;
  local_28.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  testing::internal::EqHelper::
  Compare<pstore::maybe<(anonymous_namespace)::value,_void>,_pstore::maybe<(anonymous_namespace)::value,_void>,_nullptr>
            (local_38,"pstore::nothing<value> ()","maybe<value> ()",&local_58,&local_28);
  if (local_28.valid_ == true) {
    local_28._0_8_ = local_28._0_8_ & 0xffffffffffffff00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28.storage_._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28.storage_._8_8_);
    }
  }
  if (local_58.valid_ == true) {
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.storage_._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.storage_._8_8_);
    }
  }
  if (local_38[0] == (EqHelper)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
    if ((long *)local_58._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST (Maybe, Nothing) {
    EXPECT_EQ (pstore::nothing<value> (), maybe<value> ());
}